

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void (anonymous_namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *d)

{
  byte bVar1;
  undefined1 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long in_RDI;
  mz_uint len_6;
  mz_uint bits_6;
  mz_uint len_5;
  mz_uint bits_5;
  mz_uint code;
  mz_uint len_4;
  mz_uint bits_4;
  mz_uint len_3;
  mz_uint bits_3;
  mz_uint len_2;
  mz_uint bits_2;
  mz_uint len_1;
  mz_uint bits_1;
  mz_uint len;
  mz_uint bits;
  mz_uint8 code_size;
  mz_uint8 prev_code_size;
  mz_uint8 packed_code_sizes [320];
  mz_uint8 code_sizes_to_pack [320];
  mz_uint packed_code_sizes_index;
  mz_uint rle_repeat_count;
  mz_uint rle_z_count;
  mz_uint num_packed_code_sizes;
  mz_uint total_code_sizes_to_pack;
  mz_uint i;
  int num_bit_lengths;
  int num_dist_codes;
  int num_lit_codes;
  int in_stack_00000740;
  int in_stack_00000744;
  int in_stack_00000748;
  int in_stack_0000074c;
  tdefl_compressor *in_stack_00000750;
  int local_2fc;
  byte local_2b9;
  byte abStack_2b8 [320];
  byte local_178 [332];
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_2b9 = 0xff;
  *(undefined2 *)(in_RDI + 0x83ca) = 1;
  local_8 = in_RDI;
  tdefl_optimize_huffman_table
            (in_stack_00000750,in_stack_0000074c,in_stack_00000748,in_stack_00000744,
             in_stack_00000740);
  tdefl_optimize_huffman_table
            (in_stack_00000750,in_stack_0000074c,in_stack_00000748,in_stack_00000744,
             in_stack_00000740);
  local_c = 0x11e;
  while ((0x101 < local_c && (*(char *)(local_8 + 0x8f4a + (long)(local_c + -1)) == '\0'))) {
    local_c = local_c + -1;
  }
  local_10 = 0x1e;
  while ((1 < local_10 && (*(char *)(local_8 + 0x906a + (long)(local_10 + -1)) == '\0'))) {
    local_10 = local_10 + -1;
  }
  memcpy(local_178,(void *)(local_8 + 0x8f4a),(long)local_c);
  memcpy(local_178 + local_c,(void *)(local_8 + 0x906a),(long)local_10);
  local_1c = local_c + local_10;
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  memset((void *)(local_8 + 0x864a),0,0x26);
  local_18 = 0;
  while( true ) {
    if (local_1c <= local_18) break;
    bVar1 = local_178[local_18];
    if (bVar1 == 0) {
      if (local_28 != 0) {
        if (local_28 < 3) {
          *(short *)(local_8 + 0x864a + (ulong)local_2b9 * 2) =
               *(short *)(local_8 + 0x864a + (ulong)local_2b9 * 2) + (short)local_28;
          while (uVar3 = local_20, local_28 != 0) {
            local_20 = local_20 + 1;
            local_28 = local_28 - 1;
            abStack_2b8[uVar3] = local_2b9;
          }
        }
        else {
          *(short *)(local_8 + 0x866a) = *(short *)(local_8 + 0x866a) + 1;
          uVar6 = (ulong)local_20;
          local_20 = local_20 + 1;
          abStack_2b8[uVar6] = 0x10;
          uVar3 = local_20;
          local_20 = local_20 + 1;
          abStack_2b8[uVar3] = (char)local_28 - 3;
        }
        local_28 = 0;
      }
      local_24 = local_24 + 1;
      if (local_24 == 0x8a) {
        *(short *)(local_8 + 0x866e) = *(short *)(local_8 + 0x866e) + 1;
        uVar6 = (ulong)local_20;
        local_20 = local_20 + 1;
        abStack_2b8[uVar6] = 0x12;
        uVar3 = local_20;
        local_20 = local_20 + 1;
        abStack_2b8[uVar3] = (char)local_24 - 0xb;
        local_24 = 0;
        local_24 = 0;
      }
    }
    else {
      if (local_24 != 0) {
        if (local_24 < 3) {
          *(short *)(local_8 + 0x864a) = *(short *)(local_8 + 0x864a) + (short)local_24;
          while (uVar3 = local_20, local_24 != 0) {
            local_20 = local_20 + 1;
            local_24 = local_24 - 1;
            abStack_2b8[uVar3] = 0;
          }
        }
        else if (local_24 < 0xb) {
          *(short *)(local_8 + 0x866c) = *(short *)(local_8 + 0x866c) + 1;
          uVar6 = (ulong)local_20;
          local_20 = local_20 + 1;
          abStack_2b8[uVar6] = 0x11;
          uVar3 = local_20;
          local_20 = local_20 + 1;
          abStack_2b8[uVar3] = (char)local_24 - 3;
        }
        else {
          *(short *)(local_8 + 0x866e) = *(short *)(local_8 + 0x866e) + 1;
          uVar6 = (ulong)local_20;
          local_20 = local_20 + 1;
          abStack_2b8[uVar6] = 0x12;
          uVar3 = local_20;
          local_20 = local_20 + 1;
          abStack_2b8[uVar3] = (char)local_24 - 0xb;
        }
        local_24 = 0;
      }
      if (bVar1 == local_2b9) {
        local_28 = local_28 + 1;
        if (local_28 == 6) {
          *(short *)(local_8 + 0x866a) = *(short *)(local_8 + 0x866a) + 1;
          uVar6 = (ulong)local_20;
          local_20 = local_20 + 1;
          abStack_2b8[uVar6] = 0x10;
          uVar3 = local_20;
          local_20 = local_20 + 1;
          abStack_2b8[uVar3] = (char)local_28 - 3;
          local_28 = 0;
          local_28 = 0;
        }
      }
      else {
        if (local_28 != 0) {
          if (local_28 < 3) {
            *(short *)(local_8 + 0x864a + (ulong)local_2b9 * 2) =
                 *(short *)(local_8 + 0x864a + (ulong)local_2b9 * 2) + (short)local_28;
            while (local_28 != 0) {
              uVar6 = (ulong)local_20;
              local_28 = local_28 - 1;
              local_20 = local_20 + 1;
              abStack_2b8[uVar6] = local_2b9;
            }
          }
          else {
            *(short *)(local_8 + 0x866a) = *(short *)(local_8 + 0x866a) + 1;
            uVar6 = (ulong)local_20;
            local_20 = local_20 + 1;
            abStack_2b8[uVar6] = 0x10;
            uVar6 = (ulong)local_20;
            local_20 = local_20 + 1;
            abStack_2b8[uVar6] = (char)local_28 - 3;
          }
          local_28 = 0;
        }
        uVar3 = local_20;
        *(short *)(local_8 + 0x864a + (ulong)bVar1 * 2) =
             *(short *)(local_8 + 0x864a + (ulong)bVar1 * 2) + 1;
        local_20 = local_20 + 1;
        abStack_2b8[uVar3] = bVar1;
      }
    }
    local_18 = local_18 + 1;
    local_2b9 = bVar1;
  }
  if (local_28 == 0) {
    if (local_24 != 0) {
      if (local_24 < 3) {
        *(short *)(local_8 + 0x864a) = *(short *)(local_8 + 0x864a) + (short)local_24;
        while (local_24 != 0) {
          uVar6 = (ulong)local_20;
          local_24 = local_24 - 1;
          local_20 = local_20 + 1;
          abStack_2b8[uVar6] = 0;
        }
      }
      else if (local_24 < 0xb) {
        *(short *)(local_8 + 0x866c) = *(short *)(local_8 + 0x866c) + 1;
        uVar6 = (ulong)local_20;
        local_20 = local_20 + 1;
        abStack_2b8[uVar6] = 0x11;
        uVar6 = (ulong)local_20;
        local_20 = local_20 + 1;
        abStack_2b8[uVar6] = (char)local_24 - 3;
      }
      else {
        *(short *)(local_8 + 0x866e) = *(short *)(local_8 + 0x866e) + 1;
        uVar6 = (ulong)local_20;
        local_20 = local_20 + 1;
        abStack_2b8[uVar6] = 0x12;
        uVar6 = (ulong)local_20;
        local_20 = local_20 + 1;
        abStack_2b8[uVar6] = (char)local_24 - 0xb;
      }
      local_24 = 0;
    }
  }
  else if (local_28 != 0) {
    if (local_28 < 3) {
      *(short *)(local_8 + 0x864a + (ulong)local_2b9 * 2) =
           *(short *)(local_8 + 0x864a + (ulong)local_2b9 * 2) + (short)local_28;
      while (local_28 != 0) {
        uVar6 = (ulong)local_20;
        local_28 = local_28 - 1;
        local_20 = local_20 + 1;
        abStack_2b8[uVar6] = local_2b9;
      }
    }
    else {
      *(short *)(local_8 + 0x866a) = *(short *)(local_8 + 0x866a) + 1;
      uVar6 = (ulong)local_20;
      local_20 = local_20 + 1;
      abStack_2b8[uVar6] = 0x10;
      uVar6 = (ulong)local_20;
      local_20 = local_20 + 1;
      abStack_2b8[uVar6] = (char)local_28 - 3;
    }
    local_28 = 0;
  }
  tdefl_optimize_huffman_table
            (in_stack_00000750,in_stack_0000074c,in_stack_00000748,in_stack_00000744,
             in_stack_00000740);
  *(uint *)(local_8 + 0x60) =
       2 << ((byte)*(undefined4 *)(local_8 + 0x5c) & 0x1f) | *(uint *)(local_8 + 0x60);
  *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + 2;
  while (7 < *(uint *)(local_8 + 0x5c)) {
    if (*(ulong *)(local_8 + 0x40) < *(ulong *)(local_8 + 0x48)) {
      puVar2 = *(undefined1 **)(local_8 + 0x40);
      *(undefined1 **)(local_8 + 0x40) = puVar2 + 1;
      *puVar2 = (char)*(undefined4 *)(local_8 + 0x60);
    }
    *(uint *)(local_8 + 0x60) = *(uint *)(local_8 + 0x60) >> 8;
    *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + -8;
  }
  if (0x1f < local_c - 0x101U) {
    __assert_fail("bits <= ((1U << len) - 1U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                  ,0xc3f,
                  "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                 );
  }
  *(uint *)(local_8 + 0x60) =
       local_c - 0x101U << ((byte)*(undefined4 *)(local_8 + 0x5c) & 0x1f) |
       *(uint *)(local_8 + 0x60);
  *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + 5;
  while (7 < *(uint *)(local_8 + 0x5c)) {
    if (*(ulong *)(local_8 + 0x40) < *(ulong *)(local_8 + 0x48)) {
      puVar2 = *(undefined1 **)(local_8 + 0x40);
      *(undefined1 **)(local_8 + 0x40) = puVar2 + 1;
      *puVar2 = (char)*(undefined4 *)(local_8 + 0x60);
    }
    *(uint *)(local_8 + 0x60) = *(uint *)(local_8 + 0x60) >> 8;
    *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + -8;
  }
  if (0x1f < local_10 - 1U) {
    __assert_fail("bits <= ((1U << len) - 1U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                  ,0xc40,
                  "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                 );
  }
  *(uint *)(local_8 + 0x60) =
       local_10 - 1U << ((byte)*(undefined4 *)(local_8 + 0x5c) & 0x1f) | *(uint *)(local_8 + 0x60);
  *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + 5;
  while (7 < *(uint *)(local_8 + 0x5c)) {
    if (*(ulong *)(local_8 + 0x40) < *(ulong *)(local_8 + 0x48)) {
      puVar2 = *(undefined1 **)(local_8 + 0x40);
      *(undefined1 **)(local_8 + 0x40) = puVar2 + 1;
      *puVar2 = (char)*(undefined4 *)(local_8 + 0x60);
    }
    *(uint *)(local_8 + 0x60) = *(uint *)(local_8 + 0x60) >> 8;
    *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + -8;
  }
  local_14 = 0x12;
  while ((-1 < local_14 &&
         (*(char *)(local_8 + 0x918a + (ulong)s_tdefl_packed_code_size_syms_swizzle[local_14]) ==
          '\0'))) {
    local_14 = local_14 + -1;
  }
  if (local_14 + 1 < 4) {
    local_2fc = 4;
  }
  else {
    local_2fc = local_14 + 1;
  }
  local_14 = local_2fc;
  if (0xf < local_2fc - 4U) {
    __assert_fail("bits <= ((1U << len) - 1U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                  ,0xc47,
                  "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                 );
  }
  *(uint *)(local_8 + 0x60) =
       local_2fc - 4U << ((byte)*(undefined4 *)(local_8 + 0x5c) & 0x1f) | *(uint *)(local_8 + 0x60);
  *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + 4;
  while (7 < *(uint *)(local_8 + 0x5c)) {
    if (*(ulong *)(local_8 + 0x40) < *(ulong *)(local_8 + 0x48)) {
      puVar2 = *(undefined1 **)(local_8 + 0x40);
      *(undefined1 **)(local_8 + 0x40) = puVar2 + 1;
      *puVar2 = (char)*(undefined4 *)(local_8 + 0x60);
    }
    *(uint *)(local_8 + 0x60) = *(uint *)(local_8 + 0x60) >> 8;
    *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + -8;
  }
  local_18 = 0;
  while( true ) {
    if (local_2fc <= (int)local_18) {
      local_2c = 0;
      while( true ) {
        uVar3 = local_2c;
        if (local_20 <= local_2c) {
          return;
        }
        uVar7 = local_2c + 1;
        local_2c = uVar7;
        uVar4 = (uint)abStack_2b8[uVar3];
        if (0x12 < uVar4) break;
        uVar5 = (uint)*(ushort *)(local_8 + 0x8d0a + (ulong)uVar4 * 2);
        bVar1 = *(byte *)(local_8 + 0x918a + (ulong)uVar4);
        if ((1 << (bVar1 & 0x1f)) - 1U < uVar5) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                        ,0xc50,
                        "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                       );
        }
        *(uint *)(local_8 + 0x60) =
             uVar5 << ((byte)*(undefined4 *)(local_8 + 0x5c) & 0x1f) | *(uint *)(local_8 + 0x60);
        *(uint *)(local_8 + 0x5c) = (uint)bVar1 + *(int *)(local_8 + 0x5c);
        while (7 < *(uint *)(local_8 + 0x5c)) {
          if (*(ulong *)(local_8 + 0x40) < *(ulong *)(local_8 + 0x48)) {
            puVar2 = *(undefined1 **)(local_8 + 0x40);
            *(undefined1 **)(local_8 + 0x40) = puVar2 + 1;
            *puVar2 = (char)*(undefined4 *)(local_8 + 0x60);
          }
          *(uint *)(local_8 + 0x60) = *(uint *)(local_8 + 0x60) >> 8;
          *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + -8;
        }
        if (0xf < uVar4) {
          local_2c = uVar3 + 2;
          bVar1 = "\x02\x03\a"[uVar4 - 0x10];
          if ((1 << (bVar1 & 0x1f)) - 1U < (uint)abStack_2b8[uVar7]) {
            __assert_fail("bits <= ((1U << len) - 1U)",
                          "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                          ,0xc53,
                          "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                         );
          }
          *(uint *)(local_8 + 0x60) =
               (uint)abStack_2b8[uVar7] << ((byte)*(undefined4 *)(local_8 + 0x5c) & 0x1f) |
               *(uint *)(local_8 + 0x60);
          *(int *)(local_8 + 0x5c) = (int)(char)bVar1 + *(int *)(local_8 + 0x5c);
          while (7 < *(uint *)(local_8 + 0x5c)) {
            if (*(ulong *)(local_8 + 0x40) < *(ulong *)(local_8 + 0x48)) {
              puVar2 = *(undefined1 **)(local_8 + 0x40);
              *(undefined1 **)(local_8 + 0x40) = puVar2 + 1;
              *puVar2 = (char)*(undefined4 *)(local_8 + 0x60);
            }
            *(uint *)(local_8 + 0x60) = *(uint *)(local_8 + 0x60) >> 8;
            *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + -8;
          }
        }
      }
      __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                    "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                    ,0xc4f,
                    "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                   );
    }
    uVar3 = (uint)*(byte *)(local_8 + 0x918a +
                           (ulong)s_tdefl_packed_code_size_syms_swizzle[local_18]);
    if (7 < uVar3) break;
    *(uint *)(local_8 + 0x60) =
         uVar3 << ((byte)*(undefined4 *)(local_8 + 0x5c) & 0x1f) | *(uint *)(local_8 + 0x60);
    *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + 3;
    while (7 < *(uint *)(local_8 + 0x5c)) {
      if (*(ulong *)(local_8 + 0x40) < *(ulong *)(local_8 + 0x48)) {
        puVar2 = *(undefined1 **)(local_8 + 0x40);
        *(undefined1 **)(local_8 + 0x40) = puVar2 + 1;
        *puVar2 = (char)*(undefined4 *)(local_8 + 0x60);
      }
      *(uint *)(local_8 + 0x60) = *(uint *)(local_8 + 0x60) >> 8;
      *(int *)(local_8 + 0x5c) = *(int *)(local_8 + 0x5c) + -8;
    }
    local_18 = local_18 + 1;
  }
  __assert_fail("bits <= ((1U << len) - 1U)",
                "/workspace/llm4binary/github/license_c_cmakelists/stanford-cs248[P]shading/CS248/include/CS248/tinyexr.h"
                ,0xc4a,
                "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)");
}

Assistant:

static void tdefl_start_dynamic_block(tdefl_compressor *d) {
  int num_lit_codes, num_dist_codes, num_bit_lengths;
  mz_uint i, total_code_sizes_to_pack, num_packed_code_sizes, rle_z_count,
      rle_repeat_count, packed_code_sizes_index;
  mz_uint8
      code_sizes_to_pack[TDEFL_MAX_HUFF_SYMBOLS_0 + TDEFL_MAX_HUFF_SYMBOLS_1],
      packed_code_sizes[TDEFL_MAX_HUFF_SYMBOLS_0 + TDEFL_MAX_HUFF_SYMBOLS_1],
      prev_code_size = 0xFF;

  d->m_huff_count[0][256] = 1;

  tdefl_optimize_huffman_table(d, 0, TDEFL_MAX_HUFF_SYMBOLS_0, 15, MZ_FALSE);
  tdefl_optimize_huffman_table(d, 1, TDEFL_MAX_HUFF_SYMBOLS_1, 15, MZ_FALSE);

  for (num_lit_codes = 286; num_lit_codes > 257; num_lit_codes--)
    if (d->m_huff_code_sizes[0][num_lit_codes - 1])
      break;
  for (num_dist_codes = 30; num_dist_codes > 1; num_dist_codes--)
    if (d->m_huff_code_sizes[1][num_dist_codes - 1])
      break;

  memcpy(code_sizes_to_pack, &d->m_huff_code_sizes[0][0], num_lit_codes);
  memcpy(code_sizes_to_pack + num_lit_codes, &d->m_huff_code_sizes[1][0],
         num_dist_codes);
  total_code_sizes_to_pack = num_lit_codes + num_dist_codes;
  num_packed_code_sizes = 0;
  rle_z_count = 0;
  rle_repeat_count = 0;

  memset(&d->m_huff_count[2][0], 0,
         sizeof(d->m_huff_count[2][0]) * TDEFL_MAX_HUFF_SYMBOLS_2);
  for (i = 0; i < total_code_sizes_to_pack; i++) {
    mz_uint8 code_size = code_sizes_to_pack[i];
    if (!code_size) {
      TDEFL_RLE_PREV_CODE_SIZE();
      if (++rle_z_count == 138) {
        TDEFL_RLE_ZERO_CODE_SIZE();
      }
    } else {
      TDEFL_RLE_ZERO_CODE_SIZE();
      if (code_size != prev_code_size) {
        TDEFL_RLE_PREV_CODE_SIZE();
        d->m_huff_count[2][code_size] =
            (mz_uint16)(d->m_huff_count[2][code_size] + 1);
        packed_code_sizes[num_packed_code_sizes++] = code_size;
      } else if (++rle_repeat_count == 6) {
        TDEFL_RLE_PREV_CODE_SIZE();
      }
    }
    prev_code_size = code_size;
  }
  if (rle_repeat_count) {
    TDEFL_RLE_PREV_CODE_SIZE();
  } else {
    TDEFL_RLE_ZERO_CODE_SIZE();
  }

  tdefl_optimize_huffman_table(d, 2, TDEFL_MAX_HUFF_SYMBOLS_2, 7, MZ_FALSE);

  TDEFL_PUT_BITS(2, 2);

  TDEFL_PUT_BITS(num_lit_codes - 257, 5);
  TDEFL_PUT_BITS(num_dist_codes - 1, 5);

  for (num_bit_lengths = 18; num_bit_lengths >= 0; num_bit_lengths--)
    if (d->m_huff_code_sizes
            [2][s_tdefl_packed_code_size_syms_swizzle[num_bit_lengths]])
      break;
  num_bit_lengths = MZ_MAX(4, (num_bit_lengths + 1));
  TDEFL_PUT_BITS(num_bit_lengths - 4, 4);
  for (i = 0; (int)i < num_bit_lengths; i++)
    TDEFL_PUT_BITS(
        d->m_huff_code_sizes[2][s_tdefl_packed_code_size_syms_swizzle[i]], 3);

  for (packed_code_sizes_index = 0;
       packed_code_sizes_index < num_packed_code_sizes;) {
    mz_uint code = packed_code_sizes[packed_code_sizes_index++];
    MZ_ASSERT(code < TDEFL_MAX_HUFF_SYMBOLS_2);
    TDEFL_PUT_BITS(d->m_huff_codes[2][code], d->m_huff_code_sizes[2][code]);
    if (code >= 16)
      TDEFL_PUT_BITS(packed_code_sizes[packed_code_sizes_index++],
                     "\02\03\07"[code - 16]);
  }
}